

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O3

void __thiscall
btDbvtBroadphase::rayTest
          (btDbvtBroadphase *this,btVector3 *rayFrom,btVector3 *rayTo,
          btBroadphaseRayCallback *rayCallback,btVector3 *aabbMin,btVector3 *aabbMax)

{
  BroadphaseRayTester callback;
  
  callback.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_0021b168;
  callback.m_rayCallback = rayCallback;
  btDbvt::rayTestInternal
            ((btDbvt *)&this->field_0x8,*(btDbvtNode **)&this->field_0x8,rayFrom,rayTo,
             &rayCallback->m_rayDirectionInverse,rayCallback->m_signs,rayCallback->m_lambda_max,
             aabbMin,aabbMax,&callback.super_ICollide);
  btDbvt::rayTestInternal
            ((btDbvt *)&this->field_0x68,*(btDbvtNode **)&this->field_0x68,rayFrom,rayTo,
             &rayCallback->m_rayDirectionInverse,rayCallback->m_signs,rayCallback->m_lambda_max,
             aabbMin,aabbMax,&callback.super_ICollide);
  return;
}

Assistant:

void	btDbvtBroadphase::rayTest(const btVector3& rayFrom,const btVector3& rayTo, btBroadphaseRayCallback& rayCallback,const btVector3& aabbMin,const btVector3& aabbMax)
{
	BroadphaseRayTester callback(rayCallback);

	m_sets[0].rayTestInternal(	m_sets[0].m_root,
		rayFrom,
		rayTo,
		rayCallback.m_rayDirectionInverse,
		rayCallback.m_signs,
		rayCallback.m_lambda_max,
		aabbMin,
		aabbMax,
		callback);

	m_sets[1].rayTestInternal(	m_sets[1].m_root,
		rayFrom,
		rayTo,
		rayCallback.m_rayDirectionInverse,
		rayCallback.m_signs,
		rayCallback.m_lambda_max,
		aabbMin,
		aabbMax,
		callback);

}